

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  char cVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  float *pfVar10;
  char *pcVar11;
  char *text;
  float scale;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  uint c;
  uint local_60;
  float local_5c;
  float local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  float fStack_3c;
  char **local_38;
  
  local_5c = max_width;
  local_38 = remaining;
  if (text_end == (char *)0x0) {
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
  }
  scale = size / this->FontSize;
  fVar14 = 0.0;
  uVar16 = 0;
  pcVar9 = (char *)0x0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  fVar15 = 0.0;
  fVar17 = 0.0;
  fVar13 = 0.0;
  fVar3 = fVar14;
  fVar4 = 0.0;
  uVar5 = uVar16;
  fVar6 = 0.0;
LAB_00137f65:
  do {
    fStack_3c = fVar6;
    uStack_40 = uVar5;
    fStack_44 = fVar4;
    local_48 = fVar3;
    local_58 = fVar13;
    text = text_begin;
    pcVar11 = text;
    fVar12 = fVar15;
    if (text_end <= text) goto LAB_001380e9;
    if (0.0 < wrap_width) {
      if (pcVar9 == (char *)0x0) {
        pcVar9 = CalcWordWrapPositionA(this,scale,text,text_end,wrap_width - local_58);
        pcVar9 = pcVar9 + (pcVar9 == text);
        fVar14 = local_48;
        fVar15 = fStack_44;
        uVar16 = uStack_40;
        fVar17 = fStack_3c;
      }
      if (pcVar9 <= text) {
        if (fVar14 < local_58) {
          fVar14 = local_58;
        }
        fVar15 = fVar15 + size;
        do {
          text_begin = text;
          if (text_end <= text_begin) goto LAB_0013809d;
          cVar1 = *text_begin;
          text = text_begin + 1;
        } while ((cVar1 == '\t') || (cVar1 == ' '));
        if (cVar1 == '\n') {
          text_begin = text_begin + 1;
        }
LAB_0013809d:
        pcVar9 = (char *)0x0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        fVar13 = 0.0;
        fVar3 = fVar14;
        fVar4 = fVar15;
        uVar5 = uVar16;
        fVar6 = fVar17;
        goto LAB_00137f65;
      }
    }
    local_60 = (uint)*text;
    if (*text < '\0') {
      iVar7 = ImTextCharFromUtf8(&local_60,text,text_end);
      text_begin = text + iVar7;
      pcVar11 = text_begin;
      fVar14 = local_48;
      fVar12 = fStack_44;
      uVar16 = uStack_40;
      fVar17 = fStack_3c;
      if (local_60 == 0) goto LAB_001380e9;
    }
    else {
      text_begin = text + 1;
      fVar12 = fVar15;
    }
    fVar15 = fVar12;
    if (local_60 < 0x20) {
      fVar13 = local_58;
      fVar3 = fVar14;
      fVar4 = fVar12;
      uVar5 = uVar16;
      fVar6 = fVar17;
      if (local_60 == 0xd) goto LAB_00137f65;
      if (local_60 == 10) {
        uVar16 = uStack_54 & (uint)fVar12;
        fVar14 = (float)(~-(uint)(local_58 <= fVar14) & (uint)local_58 |
                        -(uint)(local_58 <= fVar14) & (uint)fVar14);
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        fVar15 = fVar12 + size;
        fVar17 = fVar12;
        fVar13 = 0.0;
        fVar3 = fVar14;
        fVar4 = fVar12 + size;
        uVar5 = uVar16;
        fVar6 = fVar12;
        goto LAB_00137f65;
      }
    }
    pfVar10 = (this->IndexAdvanceX).Data + local_60;
    if ((this->IndexAdvanceX).Size <= (int)local_60) {
      pfVar10 = &this->FallbackAdvanceX;
    }
    fVar13 = *pfVar10 * scale + local_58;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    pcVar11 = text;
    fVar3 = local_48;
    fVar4 = fStack_44;
    uVar5 = uStack_40;
    fVar6 = fStack_3c;
    if (local_5c <= fVar13) {
LAB_001380e9:
      if (local_38 != (char **)0x0) {
        *local_38 = pcVar11;
      }
      if (fVar14 < local_58) {
        fVar14 = local_58;
      }
      if (fVar12 == 0.0 || 0.0 < local_58) {
        fVar12 = fVar12 + size;
      }
      IVar2.y = fVar12;
      IVar2.x = fVar14;
      return IVar2;
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}